

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O2

int sinfl_decode(sinfl *s,uint *tbl,int bit_len)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = s->bitbuf;
  uVar1 = tbl[(int)(~(uint)(-1L << ((byte)bit_len & 0x3f)) & (uint)uVar2)];
  if ((uVar1 & 0x10) == 0) {
    iVar3 = s->bitcnt;
  }
  else {
    uVar2 = uVar2 >> ((byte)bit_len & 0x3f);
    s->bitbuf = uVar2;
    iVar3 = s->bitcnt - bit_len;
    s->bitcnt = iVar3;
    uVar1 = tbl[(uVar1 >> 0x10) + (~(-1 << ((byte)uVar1 & 0xf)) & (uint)uVar2)];
  }
  s->bitbuf = uVar2 >> (sbyte)(uVar1 & 0xf);
  s->bitcnt = iVar3 - (uVar1 & 0xf);
  return uVar1 >> 0x10 & 0xfff;
}

Assistant:

static int
sinfl_decode(struct sinfl *s, const unsigned *tbl, int bit_len) {
  int idx = sinfl_peek(s, bit_len);
  unsigned key = tbl[idx];
  if (key & 0x10) {
    /* sub-table lookup */
    int len = key & 0x0f;
    sinfl_eat(s, bit_len);
    idx = sinfl_peek(s, len);
    key = tbl[((key >> 16) & 0xffff) + (unsigned)idx];
  }
  sinfl_eat(s, key & 0x0f);
  return (key >> 16) & 0x0fff;
}